

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,unsigned_long *args_1)

{
  pointer *pprVar1;
  idx_t iVar2;
  iterator __position;
  pointer pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  PhysicalOperator *pPVar6;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  pPVar6 = (PhysicalOperator *)ArenaAllocator::AllocateAligned(&this->arena,0x80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pLVar5 = local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pLVar4 = local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar3 = local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2 = *args_1;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar6->_vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalOperator_024ab838;
  pPVar6->type = DUMMY_SCAN;
  (pPVar6->children).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar6->children).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar6->children).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar6->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar3;
  (pPVar6->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar4;
  (pPVar6->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar5;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar6->estimated_cardinality = iVar2;
  (pPVar6->sink_state).
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (pPVar6->op_state).
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (pPVar6->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pPVar6->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pPVar6->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (pPVar6->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pPVar6->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  pPVar6->_vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalOperator_024a9598;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pPVar6;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,(reference_wrapper<duckdb::PhysicalOperator> *)&local_68);
  }
  else {
    (__position._M_current)->_M_data = pPVar6;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar6;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}